

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copper.cpp
# Opt level: O0

bool __thiscall Amiga::Copper::advance_dma(Copper *this,uint16_t position,uint16_t blitter_status)

{
  State SVar1;
  bool bVar2;
  LogLine local_58;
  LogLine local_50;
  byte local_41;
  bool should_skip_move;
  LogLine local_28;
  uint16_t local_1c;
  uint16_t local_1a;
  uint16_t blitter_status_local;
  Copper *pCStack_18;
  uint16_t position_local;
  Copper *this_local;
  
  SVar1 = this->state_;
  local_1c = blitter_status;
  local_1a = position;
  pCStack_18 = this;
  if (SVar1 == FetchFirstWord) {
    this->instruction_[0] =
         (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_
         [this->address_ & (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_mask_];
    this->address_ = this->address_ + 1;
    this->state_ = FetchSecondWord;
    Log::Logger<(Log::Source)4>::info((Logger<(Log::Source)4> *)&stack0xffffffffffffffc0);
    Log::Logger<(Log::Source)4>::LogLine::append
              ((LogLine *)&stack0xffffffffffffffc0,"First word fetch at %04x",(ulong)local_1a);
    Log::Logger<(Log::Source)4>::LogLine::~LogLine((LogLine *)&stack0xffffffffffffffc0);
  }
  else {
    if (SVar1 != FetchSecondWord) {
      if (SVar1 == Waiting) {
        bVar2 = anon_unknown.dwarf_69a411::satisfies_raster
                          (position,blitter_status,this->instruction_);
        if (bVar2) {
          Log::Logger<(Log::Source)4>::info((Logger<(Log::Source)4> *)&local_28);
          Log::Logger<(Log::Source)4>::LogLine::append
                    (&local_28,"Unblocked waiting for %04x at %04x with mask %04x",
                     (ulong)this->instruction_[0],(ulong)local_1a,
                     (ulong)(this->instruction_[1] & 0x7ffe));
          Log::Logger<(Log::Source)4>::LogLine::~LogLine(&local_28);
          this->state_ = FetchFirstWord;
        }
        return false;
      }
      return false;
    }
    local_41 = this->skip_next_ & 1;
    this->skip_next_ = false;
    this->instruction_[1] =
         (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_
         [this->address_ & (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_mask_];
    this->address_ = this->address_ + 1;
    Log::Logger<(Log::Source)4>::info((Logger<(Log::Source)4> *)&local_50);
    Log::Logger<(Log::Source)4>::LogLine::append
              (&local_50,"Second word fetch at %04x",(ulong)local_1a);
    Log::Logger<(Log::Source)4>::LogLine::~LogLine(&local_50);
    if ((this->instruction_[0] & 1) == 0) {
      if ((local_41 & 1) == 0) {
        this->instruction_[0] = this->instruction_[0] & 0x1fe;
        if ((this->instruction_[0] < 0x10) ||
           ((this->instruction_[0] < 0x20 && ((this->control_ & 1) == 0)))) {
          Log::Logger<(Log::Source)4>::info((Logger<(Log::Source)4> *)&local_58);
          Log::Logger<(Log::Source)4>::LogLine::append
                    (&local_58,"Invalid MOVE to %04x; stopping",(ulong)this->instruction_[0]);
          Log::Logger<(Log::Source)4>::LogLine::~LogLine(&local_58);
          this->state_ = Stopped;
          return true;
        }
        Chipset::write((this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.chipset_,
                       (uint)this->instruction_[0],(void *)(ulong)this->instruction_[1],1);
      }
      this->state_ = FetchFirstWord;
    }
    else if ((this->instruction_[1] & 1) == 0) {
      this->state_ = Waiting;
    }
    else {
      bVar2 = anon_unknown.dwarf_69a411::satisfies_raster(local_1a,local_1c,this->instruction_);
      this->skip_next_ = bVar2;
      this->state_ = FetchFirstWord;
    }
  }
  return true;
}

Assistant:

bool Copper::advance_dma(uint16_t position, uint16_t blitter_status) {
	switch(state_) {
		default: return false;

		case State::Waiting:
			if(satisfies_raster(position, blitter_status, instruction_)) {
				logger.info().append("Unblocked waiting for %04x at %04x with mask %04x", instruction_[0], position, instruction_[1] & 0x7ffe);
				state_ = State::FetchFirstWord;
			}
		return false;

		case State::FetchFirstWord:
			instruction_[0] = ram_[address_ & ram_mask_];
			++address_;
			state_ = State::FetchSecondWord;
			logger.info().append("First word fetch at %04x", position);
		break;

		case State::FetchSecondWord: {
			// Get and reset the should-skip-next flag.
			const bool should_skip_move = skip_next_;
			skip_next_ = false;

			// Read in the second instruction word.
			instruction_[1] = ram_[address_ & ram_mask_];
			++address_;
			logger.info().append("Second word fetch at %04x", position);

			// Check for a MOVE.
			if(!(instruction_[0] & 1)) {
				if(!should_skip_move) {
					// Stop if this move would be a privilege violation.
					instruction_[0] &= 0x1fe;
					if((instruction_[0] < 0x10) || (instruction_[0] < 0x20 && !(control_&1))) {
						logger.info().append("Invalid MOVE to %04x; stopping", instruction_[0]);
						state_ = State::Stopped;
						break;
					}

					chipset_.write(instruction_[0], instruction_[1]);
				}

				// Roll onto the next command.
				state_ = State::FetchFirstWord;
				break;
			}

			// Got to here => this is a WAIT or a SKIP.

			if(!(instruction_[1] & 1)) {
				// A WAIT. The wait-for-start-of-next PAL wait of
				// $FFDF,$FFFE seems to suggest evaluation will happen
				// in the next cycle rather than this one.
				state_ = State::Waiting;
				break;
			}

			// Neither a WAIT nor a MOVE => a SKIP.

			skip_next_ = satisfies_raster(position, blitter_status, instruction_);
			state_ = State::FetchFirstWord;
		} break;
	}

	return true;
}